

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigRepr.c
# Opt level: O3

int Aig_TransferMappedClasses(Aig_Man_t *pAig,Aig_Man_t *pPart,int *pMapBack)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  Vec_Ptr_t *pVVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  Vec_Ptr_t *pVVar9;
  Aig_Obj_t *pAVar10;
  Aig_Obj_t *pAVar11;
  
  iVar7 = 0;
  if ((pPart->pReprs != (Aig_Obj_t **)0x0) && (pVVar9 = pPart->vObjs, iVar7 = 0, 0 < pVVar9->nSize))
  {
    lVar8 = 0;
    iVar7 = 0;
    do {
      if (pVVar9->pArray[lVar8] != (void *)0x0) {
        iVar1 = *(int *)((long)pVVar9->pArray[lVar8] + 0x24);
        if (pPart->pReprs[iVar1] != (Aig_Obj_t *)0x0) {
          pVVar5 = pAig->vObjs;
          if (pVVar5 == (Vec_Ptr_t *)0x0) {
            pAVar10 = (Aig_Obj_t *)0x0;
            pAVar11 = (Aig_Obj_t *)0x0;
          }
          else {
            uVar2 = pMapBack[iVar1];
            if (((int)uVar2 < 0) || (pVVar5->nSize <= (int)uVar2)) {
LAB_00641aca:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                            ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
            }
            uVar3 = pMapBack[pPart->pReprs[iVar1]->Id];
            if (((long)(int)uVar3 < 0) || ((uint)pVVar5->nSize <= uVar3)) goto LAB_00641aca;
            pAVar10 = (Aig_Obj_t *)pVVar5->pArray[uVar2];
            pAVar11 = (Aig_Obj_t *)pVVar5->pArray[(int)uVar3];
          }
          if (pAig->pReprs == (Aig_Obj_t **)0x0) {
            __assert_fail("p->pReprs != NULL",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigRepr.c"
                          ,0x6b,"void Aig_ObjSetRepr_(Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
          }
          if (((ulong)pAVar10 & 1) != 0) {
            __assert_fail("!Aig_IsComplement(pNode1)",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigRepr.c"
                          ,0x6c,"void Aig_ObjSetRepr_(Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
          }
          if (((ulong)pAVar11 & 1) != 0) {
            __assert_fail("!Aig_IsComplement(pNode2)",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigRepr.c"
                          ,0x6d,"void Aig_ObjSetRepr_(Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
          }
          iVar1 = pAVar10->Id;
          if (pAig->nReprsAlloc <= iVar1) {
            __assert_fail("pNode1->Id < p->nReprsAlloc",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigRepr.c"
                          ,0x6e,"void Aig_ObjSetRepr_(Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
          }
          iVar4 = pAVar11->Id;
          if (pAig->nReprsAlloc <= iVar4) {
            __assert_fail("pNode2->Id < p->nReprsAlloc",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigRepr.c"
                          ,0x6f,"void Aig_ObjSetRepr_(Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
          }
          iVar7 = iVar7 + 1;
          if (pAVar10 != pAVar11) {
            iVar6 = iVar4;
            if (iVar4 < iVar1) {
              iVar6 = iVar1;
            }
            if (iVar1 < iVar4) {
              pAVar11 = pAVar10;
            }
            pAig->pReprs[iVar6] = pAVar11;
            pVVar9 = pPart->vObjs;
          }
        }
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < pVVar9->nSize);
  }
  return iVar7;
}

Assistant:

int Aig_TransferMappedClasses( Aig_Man_t * pAig, Aig_Man_t * pPart, int * pMapBack )
{
    Aig_Obj_t * pObj;
    int nClasses, k;
    nClasses = 0;
    if ( pPart->pReprs ) {
      Aig_ManForEachObj( pPart, pObj, k )
      {
          if ( pPart->pReprs[pObj->Id] == NULL )
              continue;
          nClasses++;
          Aig_ObjSetRepr_( pAig,
              Aig_ManObj(pAig, pMapBack[pObj->Id]),
              Aig_ManObj(pAig, pMapBack[pPart->pReprs[pObj->Id]->Id]) );
      }
    }
    return nClasses;
}